

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<bool>::emplace<bool&>(QPodArrayOps<bool> *this,qsizetype i,bool *args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  bool *pbVar3;
  byte bVar4;
  byte *in_RDX;
  QArrayDataPointer<bool> *in_RSI;
  QArrayDataPointer<bool> *in_RDI;
  bool *where;
  GrowthPosition pos;
  bool tmp;
  bool detach;
  QArrayDataPointer<bool> *in_stack_ffffffffffffffd8;
  undefined4 uVar5;
  undefined2 in_stack_ffffffffffffffe4;
  
  uVar1 = QArrayDataPointer<bool>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<bool> *)in_RDI->size) &&
       (qVar2 = QArrayDataPointer<bool>::freeSpaceAtEnd(in_stack_ffffffffffffffd8), qVar2 != 0)) {
      pbVar3 = QArrayDataPointer<bool>::end(in_RDI);
      *pbVar3 = (bool)(*in_RDX & 1);
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == (QArrayDataPointer<bool> *)0x0) &&
       (qVar2 = QArrayDataPointer<bool>::freeSpaceAtBegin(in_stack_ffffffffffffffd8), qVar2 != 0)) {
      pbVar3 = QArrayDataPointer<bool>::begin((QArrayDataPointer<bool> *)0x1e4b78);
      pbVar3[-1] = (bool)(*in_RDX & 1);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  bVar4 = *in_RDX & 1;
  uVar5 = 0;
  if ((in_RDI->size != 0) && (in_RSI == (QArrayDataPointer<bool> *)0x0)) {
    uVar5 = 1;
  }
  QArrayDataPointer<bool>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
             CONCAT17(uVar1,CONCAT16(*in_RDX,CONCAT24(in_stack_ffffffffffffffe4,uVar5))) &
             0xff01ffffffffffff,(bool **)in_stack_ffffffffffffffd8,in_RDI);
  pbVar3 = createHole((QPodArrayOps<bool> *)in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
                      CONCAT17(uVar1,CONCAT16(bVar4,CONCAT24(in_stack_ffffffffffffffe4,uVar5))),
                      (qsizetype)in_stack_ffffffffffffffd8);
  *pbVar3 = (bool)(bVar4 & 1);
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }